

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O1

ostream * miniros::operator<<(ostream *os,SteadyTime *rhs)

{
  long lVar1;
  ostream oVar2;
  ostream *poVar3;
  ostream *poVar4;
  IosFlagSaver s;
  IosFlagSaver IStack_48;
  
  IosFlagSaver::IosFlagSaver(&IStack_48,os);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
  lVar1 = *(long *)poVar3;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x10) = 9;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar4 = poVar3 + lVar1;
  if (poVar3[lVar1 + 0xe1] == (ostream)0x0) {
    oVar2 = (ostream)std::ios::widen((char)poVar4);
    poVar4[0xe0] = oVar2;
    poVar4[0xe1] = (ostream)0x1;
  }
  poVar4[0xe0] = (ostream)0x30;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  IosFlagSaver::restore(&IStack_48);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream& os, const SteadyTime &rhs)
  {
	IosFlagSaver s(os);
    os << rhs.sec << "." << std::setw(9) << std::setfill('0') << rhs.nsec;
    return os;
  }